

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O1

DiyFp __thiscall rapidjson::internal::DiyFp::Normalize(DiyFp *this)

{
  ulong uVar1;
  ulong uVar2;
  DiyFp DVar3;
  
  uVar1 = this->f;
  if (uVar1 != 0) {
    uVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    DVar3.f = uVar1 << ((byte)(uVar2 ^ 0x3f) & 0x3f);
    DVar3.e = this->e - (int)(uVar2 ^ 0x3f);
    DVar3._12_4_ = 0;
    return DVar3;
  }
  __assert_fail("f != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/internal/diyfp.h"
                ,0x67,"DiyFp rapidjson::internal::DiyFp::Normalize() const");
}

Assistant:

DiyFp Normalize() const {
        RAPIDJSON_ASSERT(f != 0); // https://stackoverflow.com/a/26809183/291737
#if defined(_MSC_VER) && defined(_M_AMD64)
        unsigned long index;
        _BitScanReverse64(&index, f);
        return DiyFp(f << (63 - index), e - (63 - index));
#elif defined(__GNUC__) && __GNUC__ >= 4
        int s = __builtin_clzll(f);
        return DiyFp(f << s, e - s);
#else
        DiyFp res = *this;
        while (!(res.f & (static_cast<uint64_t>(1) << 63))) {
            res.f <<= 1;
            res.e--;
        }
        return res;
#endif
    }